

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-profile.c
# Opt level: O3

int lstop(lua_State *L)

{
  lua_Number lVar1;
  lua_Number lVar2;
  double dVar3;
  timespec ti;
  timespec local_20;
  
  lua_pushthread(L);
  lua_rawget(L,-0xf4629);
  luaL_checktype(L,-1,3);
  lVar1 = lua_tonumberx(L,-1,(int *)0x0);
  clock_gettime(3,&local_20);
  dVar3 = (double)(int)local_20.tv_nsec / 1000000000.0 + (double)(ushort)local_20.tv_sec;
  lua_pushthread(L);
  lua_rawget(L,-0xf462a);
  lVar2 = lua_tonumberx(L,-1,(int *)0x0);
  lua_pushthread(L);
  lua_pushnil(L);
  lua_rawset(L,-0xf4629);
  lua_pushthread(L);
  lua_pushnil(L);
  lua_rawset(L,-0xf462a);
  lua_pushnumber(L,lVar2 + ((double)(~-(ulong)(dVar3 < lVar1) & (ulong)dVar3 |
                                    (ulong)(dVar3 + 65536.0) & -(ulong)(dVar3 < lVar1)) - lVar1));
  return 1;
}

Assistant:

static int
lstop(lua_State *L) {
	lua_pushthread(L);
	lua_rawget(L, lua_upvalueindex(1));
	luaL_checktype(L, -1, LUA_TNUMBER);
	double ti = diff_time(lua_tonumber(L, -1));
	lua_pushthread(L);
	lua_rawget(L, lua_upvalueindex(2));
	double total_time = lua_tonumber(L, -1);

	lua_pushthread(L);
	lua_pushnil(L);
	lua_rawset(L, lua_upvalueindex(1));

	lua_pushthread(L);
	lua_pushnil(L);
	lua_rawset(L, lua_upvalueindex(2));

	lua_pushnumber(L, ti + total_time);

	return 1;
}